

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O2

ByteData *
cfd::core::WallyUtil::ConvertMnemonicToSeed
          (ByteData *__return_storage_ptr__,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *passphrase,bool use_ideographic_space)

{
  CfdException *this;
  undefined7 in_register_00000009;
  allocator local_a5;
  int ret;
  size_t out_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> seed_bytes;
  undefined1 local_80 [32];
  string mnemonic_sentence;
  string delimitor;
  
  ::std::__cxx11::string::string((string *)&delimitor," ",(allocator *)&mnemonic_sentence);
  if ((int)CONCAT71(in_register_00000009,use_ideographic_space) != 0) {
    ::std::__cxx11::string::assign((char *)&delimitor);
  }
  StringUtil::Join((string *)&mnemonic_sentence,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)mnemonic,(string *)&delimitor);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&seed_bytes,0x40,(allocator_type *)local_80);
  out_size = 0;
  ret = bip39_mnemonic_to_seed
                  (mnemonic_sentence._M_dataplus._M_p,(passphrase->_M_dataplus)._M_p,
                   seed_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,0x40,&out_size);
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&seed_bytes,out_size);
    ByteData::ByteData(__return_storage_ptr__,&seed_bytes);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&seed_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::__cxx11::string::~string((string *)&mnemonic_sentence);
    ::std::__cxx11::string::~string((string *)&delimitor);
    return __return_storage_ptr__;
  }
  local_80._0_8_ = "cfdcore_wally_util.cpp";
  local_80._8_4_ = 0xda;
  local_80._16_8_ = "ConvertMnemonicToSeed";
  logger::warn<int&>((CfdSourceLocation *)local_80,"Convert mnemonic to seed error. ret=[{}]",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_80,"Convert mnemonic to seed error.",&local_a5);
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_80);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData WallyUtil::ConvertMnemonicToSeed(
    const std::vector<std::string>& mnemonic, const std::string& passphrase,
    bool use_ideographic_space) {
  std::string delimitor = kMnemonicDelimiter;
  if (use_ideographic_space) {
    delimitor = kMnemonicIdeographicDelimiter;
  }
  std::string mnemonic_sentence = StringUtil::Join(mnemonic, delimitor);
  std::vector<uint8_t> seed_bytes(kByteData512Length);
  size_t out_size = 0;
  int ret = bip39_mnemonic_to_seed(
      mnemonic_sentence.c_str(), passphrase.c_str(), seed_bytes.data(),
      kSeedBytesLen, &out_size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Convert mnemonic to seed error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Convert mnemonic to seed error.");
  }

  seed_bytes.resize(out_size);
  ByteData seed(seed_bytes);

  return seed;
}